

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::trigger_auto_manage(session_impl *this)

{
  bool bVar1;
  type local_38;
  int local_2c;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  session_impl *local_10;
  session_impl *this_local;
  
  if (((this->m_pending_auto_manage & 1U) == 0) && ((this->m_abort & 1U) == 0)) {
    local_10 = this;
    local_20.__d.__r = (duration)time_now();
    local_18.__r = (rep)::std::chrono::operator-(&local_20,&this->m_last_auto_manage);
    local_2c = 1;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_28,&local_2c);
    bVar1 = ::std::chrono::operator<(&local_18,&local_28);
    if (bVar1) {
      this->m_auto_manage_time_scaler = 0;
    }
    else {
      this->m_pending_auto_manage = true;
      this->m_need_auto_manage = true;
      local_38.this = this;
      boost::asio::
      post<boost::asio::io_context,libtorrent::aux::session_impl::trigger_auto_manage()::__0>
                (this->m_io_context,&local_38,(type *)0x0);
    }
  }
  return;
}

Assistant:

void session_impl::trigger_auto_manage()
	{
		if (m_pending_auto_manage || m_abort) return;

		// we recalculated auto-managed torrents less than a second ago,
		// put it off one second.
		if (time_now() - m_last_auto_manage < seconds(1))
		{
			m_auto_manage_time_scaler = 0;
			return;
		}
		m_pending_auto_manage = true;
		m_need_auto_manage = true;

		post(m_io_context, [this]{ wrap(&session_impl::on_trigger_auto_manage); });
	}